

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall
QDateTimeEditPrivate::emitSignals(QDateTimeEditPrivate *this,EmitPolicy ep,QVariant *old)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  QDateTimeEdit *this_00;
  byte bVar4;
  int iVar5;
  int iVar6;
  QTime _t1;
  long lVar7;
  long lVar8;
  long lVar9;
  QDate _t1_00;
  long in_FS_OFFSET;
  bool bVar10;
  bool bVar11;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (ep != NeverEmit) {
    this_00 = *(QDateTimeEdit **)
               &(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
    puVar1 = &(this->super_QAbstractSpinBoxPrivate).field_0x3d0;
    *puVar1 = *puVar1 & 0xfe;
    lVar7 = ::QVariant::toDate();
    uVar2 = (this->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
            super_QFlagsStorage<QDateTimeEdit::Section>.i;
    bVar10 = true;
    if (ep != AlwaysEmit) {
      lVar8 = ::QVariant::toDate();
      lVar9 = ::QVariant::toDate();
      bVar10 = lVar8 != lVar9;
    }
    local_50.d._0_4_ = ::QVariant::toTime();
    bVar4 = QTime::isValid();
    uVar3 = (this->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
            super_QFlagsStorage<QDateTimeEdit::Section>.i;
    bVar11 = true;
    if (ep != AlwaysEmit) {
      iVar5 = ::QVariant::toTime();
      iVar6 = ::QVariant::toTime();
      bVar11 = iVar5 != iVar6;
    }
    (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
              (&local_50,this);
    updateCache(this,&(this->super_QAbstractSpinBoxPrivate).value,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    syncCalendarWidget(this);
    if ((bVar10 | bVar11) == 1) {
      ::QVariant::toDateTime();
      QDateTimeEdit::dateTimeChanged(this_00,(QDateTime *)&local_50);
      QDateTime::~QDateTime((QDateTime *)&local_50);
    }
    if (((lVar7 + 0xb69eeff91fU < 0x16d3e147974 && (uVar2 & 0x3f00) != 0) & bVar10) == 1) {
      _t1_00.jd = ::QVariant::toDate();
      QDateTimeEdit::dateChanged(this_00,_t1_00);
    }
    if ((bVar4 & (uVar3 & 0x7f) != 0 & bVar11) == 1) {
      _t1.mds = ::QVariant::toTime();
      QDateTimeEdit::timeChanged(this_00,_t1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::emitSignals(EmitPolicy ep, const QVariant &old)
{
    Q_Q(QDateTimeEdit);
    if (ep == NeverEmit) {
        return;
    }
    pendingEmit = false;

    const bool dodate = value.toDate().isValid() && (sections & DateSectionMask);
    const bool datechanged = (ep == AlwaysEmit || old.toDate() != value.toDate());
    const bool dotime = value.toTime().isValid() && (sections & TimeSectionMask);
    const bool timechanged = (ep == AlwaysEmit || old.toTime() != value.toTime());

    updateCache(value, displayText());

    syncCalendarWidget();
    if (datechanged || timechanged)
        emit q->dateTimeChanged(value.toDateTime());
    if (dodate && datechanged)
        emit q->dateChanged(value.toDate());
    if (dotime && timechanged)
        emit q->timeChanged(value.toTime());

}